

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::format_uint<4u,char,unsigned_int>
                 (char *buffer,uint value,int num_digits,bool upper)

{
  char *local_38;
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  int num_digits_local;
  uint value_local;
  char *buffer_local;
  
  value_local = value;
  buffer_local = buffer + num_digits;
  do {
    if (upper) {
      local_38 = "0123456789ABCDEF";
    }
    else {
      local_38 = "0123456789abcdef";
    }
    buffer_local[-1] = local_38[value_local & 0xf];
    value_local = value_local >> 4;
    buffer_local = buffer_local + -1;
  } while (value_local != 0);
  return buffer + num_digits;
}

Assistant:

inline Char *format_uint(Char *buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char *end = buffer;
  do {
    const char *digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}